

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

bool __thiscall SVGChart::PainterTester::Draw(PainterTester *this,Painter *inPainter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int theVDescent_h;
  int theVDescent_y;
  int theVDescent_x;
  int theVAscent_h;
  int theVAscent_y;
  int theVAscent_x;
  int theHDescent_w;
  int theHDescent_y;
  int theHDescent_x;
  int theHAscent_w;
  int theHAscent_y;
  int theHAscent_x;
  int theOffset;
  int theWidth;
  char *theString;
  Painter *inPainter_local;
  PainterTester *this_local;
  
  iVar1 = (*inPainter->_vptr_Painter[8])(inPainter,"The quick brown fox...");
  iVar2 = iVar1 / 10;
  iVar3 = (*inPainter->_vptr_Painter[9])();
  uVar4 = iVar2 + iVar3 * 2;
  (**inPainter->_vptr_Painter)((float)(int)uVar4,0x41200000,(float)(int)(uVar4 + iVar1),0x41200000);
  iVar3 = (*inPainter->_vptr_Painter[9])();
  uVar5 = iVar3 + 10;
  (**inPainter->_vptr_Painter)
            ((float)(int)uVar4,(float)(int)uVar5,(float)(int)(uVar4 + iVar1),(float)(int)uVar5);
  uVar6 = iVar1 + 10;
  (**inPainter->_vptr_Painter)
            ((float)iVar2,(float)(int)uVar6,(float)iVar2,(float)(int)(uVar6 + -iVar1));
  iVar3 = (*inPainter->_vptr_Painter[9])();
  uVar7 = iVar2 + iVar3;
  (**inPainter->_vptr_Painter)
            ((float)(int)uVar7,(float)(int)uVar6,(float)(int)uVar7,(float)(int)(uVar6 + -iVar1));
  (*inPainter->_vptr_Painter[0xb])
            (0xc2b40000,inPainter,(ulong)uVar7,(ulong)uVar6,"The quick brown fox...");
  (*inPainter->_vptr_Painter[10])(inPainter,(ulong)uVar4,(ulong)uVar5,"The quick brown fox...");
  return true;
}

Assistant:

bool PainterTester::Draw (Painter &inPainter) {

      const char * theString = "The quick brown fox...";
      int theWidth = inPainter.CalculateTextDrawSize (theString);
      int theOffset = theWidth/10;

      // a horizontal lines
      int theHAscent_x = theOffset+2*inPainter.GetFontHeight ();
      int theHAscent_y = 10;
      int theHAscent_w = theWidth;
      inPainter.DrawLine (theHAscent_x, theHAscent_y, theHAscent_x+theHAscent_w, theHAscent_y);

      int theHDescent_x = theHAscent_x;
      int theHDescent_y = theHAscent_y+inPainter.GetFontHeight ();
      int theHDescent_w = theHAscent_w;
      inPainter.DrawLine (theHDescent_x, theHDescent_y, theHDescent_x+theHDescent_w, theHDescent_y);
      
      // a vertical lines
      int theVAscent_x = theOffset;
      int theVAscent_y = theHAscent_y+theWidth;
      int theVAscent_h = -theWidth;
      inPainter.DrawLine (theVAscent_x, theVAscent_y, theVAscent_x, theVAscent_y+theVAscent_h);

      int theVDescent_x = theVAscent_x+inPainter.GetFontHeight ();
      int theVDescent_y = theVAscent_y;
      int theVDescent_h = theVAscent_h;
      inPainter.DrawLine (theVDescent_x, theVDescent_y, theVDescent_x, theVDescent_y+theVDescent_h);

      // Draw vertical text, followed by horizontal.
      inPainter.DrawRotatedText (theVDescent_x, theVDescent_y, -90, theString);
      inPainter.DrawText (theHDescent_x, theHDescent_y, theString);

      return true;
    }